

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O2

void __thiscall
duckdb::PatasScanState<double>::PatasScanState(PatasScanState<double> *this,ColumnSegment *segment)

{
  BufferHandle *this_00;
  idx_t iVar1;
  BufferManager *pBVar2;
  data_ptr_t pdVar3;
  BufferHandle BStack_38;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__PatasScanState_0279d770;
  this_00 = &this->handle;
  BufferHandle::BufferHandle(this_00);
  this->total_value_count = 0;
  (this->group_state).byte_reader.buffer = (uint8_t *)0x0;
  (this->group_state).byte_reader.index = 0;
  this->segment = segment;
  this->count = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
                super___atomic_base<unsigned_long>._M_i;
  pBVar2 = BufferManager::GetBufferManager(segment->db);
  (*pBVar2->_vptr_BufferManager[7])(&BStack_38,pBVar2,&segment->block);
  BufferHandle::operator=(this_00,&BStack_38);
  BufferHandle::~BufferHandle(&BStack_38);
  pdVar3 = BufferHandle::Ptr(this_00);
  iVar1 = segment->offset;
  this->segment_data = pdVar3 + iVar1;
  this->metadata_ptr = pdVar3 + iVar1 + *(uint *)(pdVar3 + iVar1);
  return;
}

Assistant:

explicit PatasScanState(ColumnSegment &segment) : segment(segment), count(segment.count) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);

		handle = buffer_manager.Pin(segment.block);
		// ScanStates never exceed the boundaries of a Segment,
		// but are not guaranteed to start at the beginning of the Block
		segment_data = handle.Ptr() + segment.GetBlockOffset();
		auto metadata_offset = Load<uint32_t>(segment_data);
		metadata_ptr = segment_data + metadata_offset;
	}